

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O0

float64 helper_frecpx_f64_aarch64(float64 a,void *fpstp)

{
  int iVar1;
  float64 value;
  uint64_t uVar2;
  undefined8 local_48;
  float64 nan;
  int64_t exp;
  uint64_t sbit;
  uint64_t val64;
  float_status *fpst;
  void *fpstp_local;
  float64 a_local;
  
  iVar1 = float64_is_any_nan(a);
  if (iVar1 == 0) {
    value = float64_squash_input_denormal_aarch64(a,(float_status *)fpstp);
    uVar2 = extract64(value,0x34,0xb);
    if (uVar2 == 0) {
      a_local = value & 0x8000000000000000 | 0x7fe0000000000000;
    }
    else {
      a_local = value & 0x8000000000000000 | ((uVar2 ^ 0xffffffffffffffff) & 0x7ff) << 0x34;
    }
  }
  else {
    iVar1 = float64_is_signaling_nan_aarch64(a,(float_status *)fpstp);
    local_48 = a;
    if (iVar1 != 0) {
      float_raise_aarch64('\x01',(float_status *)fpstp);
      local_48 = float64_silence_nan_aarch64(a,(float_status *)fpstp);
    }
    if (*(char *)((long)fpstp + 6) != '\0') {
      local_48 = float64_default_nan_aarch64((float_status *)fpstp);
    }
    a_local = local_48;
  }
  return a_local;
}

Assistant:

float64 HELPER(frecpx_f64)(float64 a, void *fpstp)
{
    float_status *fpst = fpstp;
    uint64_t val64, sbit;
    int64_t exp;

    if (float64_is_any_nan(a)) {
        float64 nan = a;
        if (float64_is_signaling_nan(a, fpst)) {
            float_raise(float_flag_invalid, fpst);
            nan = float64_silence_nan(a, fpst);
        }
        if (fpst->default_nan_mode) {
            nan = float64_default_nan(fpst);
        }
        return nan;
    }

    a = float64_squash_input_denormal(a, fpst);

    val64 = float64_val(a);
    sbit = 0x8000000000000000ULL & val64;
    exp = extract64(float64_val(a), 52, 11);

    if (exp == 0) {
        return make_float64(sbit | (0x7feULL << 52));
    } else {
        return make_float64(sbit | (~exp & 0x7ffULL) << 52);
    }
}